

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerUnaryHelperMemWithBoolReference
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool useBoolForBailout)

{
  Func *this_00;
  StackSym *stackSym;
  SymOpnd *src;
  RegOpnd *dst;
  Instr *pIVar1;
  SymOpnd *opndBailoutArg;
  
  if (this->m_func->tempSymBool == (StackSym *)0x0) {
    stackSym = StackSym::New(TyUint8,this->m_func);
    this_00 = this->m_func;
    this_00->tempSymBool = stackSym;
    Func::StackAllocate(this_00,stackSym,1);
  }
  src = IR::SymOpnd::New(&this->m_func->tempSymBool->super_Sym,TyUint8,this->m_func);
  dst = IR::RegOpnd::New(TyInt64,this->m_func);
  InsertLea(dst,&src->super_Opnd,instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&dst->super_Opnd);
  opndBailoutArg = (SymOpnd *)0x0;
  if (useBoolForBailout) {
    opndBailoutArg = src;
  }
  LoadScriptContext(this,instr);
  pIVar1 = LowerUnaryHelper(this,instr,helperMethod,&opndBailoutArg->super_Opnd);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerUnaryHelperMemWithBoolReference(IR::Instr *instr, IR::JnHelperMethod helperMethod, bool useBoolForBailout)
{
    if (!this->m_func->tempSymBool)
    {
        this->m_func->tempSymBool = StackSym::New(TyUint8, this->m_func);
        this->m_func->StackAllocate(this->m_func->tempSymBool, TySize[TyUint8]);
    }
    IR::SymOpnd * boolOpnd = IR::SymOpnd::New(this->m_func->tempSymBool, TyUint8, this->m_func);
    IR::RegOpnd * boolRefOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
    InsertLea(boolRefOpnd, boolOpnd, instr);

    m_lowererMD.LoadHelperArgument(instr, boolRefOpnd);

    return this->LowerUnaryHelperMem(instr, helperMethod, useBoolForBailout ? boolOpnd : nullptr);
}